

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TrainManager.hpp
# Opt level: O0

void __thiscall sjtu::TrainManager::query_transfer(TrainManager *this,int argc,string *argv)

{
  bool bVar1;
  undefined8 uVar2;
  long in_RDX;
  int in_ESI;
  TrainManager *in_RDI;
  int i;
  string keyword;
  string date;
  char *in_stack_fffffffffffffe58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe60;
  invalid_command *in_stack_fffffffffffffe70;
  string *in_stack_fffffffffffffe78;
  timeType *in_stack_fffffffffffffe80;
  string *psVar3;
  string *local_178;
  string *local_128;
  string local_118 [36];
  undefined1 local_f4 [20];
  string local_e0 [32];
  undefined1 local_c0 [16];
  int local_b0;
  allocator local_99;
  string local_98 [32];
  string local_78 [32];
  string local_58 [32];
  string local_38 [32];
  long local_18;
  int local_c;
  
  local_128 = local_58;
  local_18 = in_RDX;
  local_c = in_ESI;
  do {
    std::__cxx11::string::string(local_128);
    local_128 = local_128 + 0x20;
  } while (local_128 != (string *)&local_18);
  std::__cxx11::string::string(local_78);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_98,"",&local_99);
  std::allocator<char>::~allocator((allocator<char> *)&local_99);
  local_b0 = 0;
  do {
    if (local_c <= local_b0) {
      bVar1 = std::operator==(in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
      if (bVar1) {
        std::__cxx11::string::string(local_e0,local_78);
        timeType::timeType(in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
        query_transfer_cmp<sjtu::cmp_time>(in_RDI,local_58,local_c0);
        std::__cxx11::string::~string(local_e0);
      }
      else {
        std::__cxx11::string::string(local_118,local_78);
        timeType::timeType(in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
        query_transfer_cmp<sjtu::cmp_cost>(in_RDI,local_58,local_f4);
        std::__cxx11::string::~string(local_118);
      }
      std::__cxx11::string::~string(local_98);
      std::__cxx11::string::~string(local_78);
      psVar3 = local_58;
      local_178 = (string *)&local_18;
      do {
        local_178 = local_178 + -0x20;
        std::__cxx11::string::~string(local_178);
      } while (local_178 != psVar3);
      return;
    }
    bVar1 = std::operator==(in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
    if (bVar1) {
      std::__cxx11::string::operator=(local_58,(string *)((long)local_b0 * 0x20 + 0x20 + local_18));
    }
    else {
      bVar1 = std::operator==(in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
      if (bVar1) {
        std::__cxx11::string::operator=
                  (local_38,(string *)((long)local_b0 * 0x20 + 0x20 + local_18));
      }
      else {
        bVar1 = std::operator==(in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
        if (bVar1) {
          std::__cxx11::string::operator=
                    (local_78,(string *)((long)local_b0 * 0x20 + 0x20 + local_18));
        }
        else {
          bVar1 = std::operator==(in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
          if (!bVar1) {
            uVar2 = __cxa_allocate_exception(0x68);
            invalid_command::invalid_command(in_stack_fffffffffffffe70);
            __cxa_throw(uVar2,&invalid_command::typeinfo,invalid_command::~invalid_command);
          }
          std::__cxx11::string::operator=
                    (local_98,(string *)((long)local_b0 * 0x20 + 0x20 + local_18));
        }
      }
    }
    local_b0 = local_b0 + 2;
  } while( true );
}

Assistant:

void query_transfer(int argc , std::string *argv)
		{
			std::string station[2] , date , keyword = "";
			for (int i = 0;i < argc;i += 2)
				if (argv[i] == "-s") station[0] = argv[i + 1];
				else if (argv[i] == "-t") station[1] = argv[i + 1];
				else if (argv[i] == "-d") date = argv[i + 1];
				else if (argv[i] == "-p") keyword = argv[i + 1];
				else throw invalid_command();
			if (keyword == "time") query_transfer_cmp(station , date , cmp_time());
			else query_transfer_cmp(station , date , cmp_cost());
		}